

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_he_2008.h
# Opt level: O1

void __thiscall RBTS<RemSP>::FirstScan(RBTS<RemSP> *this)

{
  size_t *psVar1;
  int iVar2;
  uint uVar3;
  Mat1i *pMVar4;
  Mat1b *pMVar5;
  int *piVar6;
  int *piVar7;
  bool bVar8;
  uint uVar9;
  bool bVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  size_t sVar27;
  size_t sVar28;
  int iVar29;
  int iVar30;
  long local_60;
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  local_60 = 0;
  memset(*(void **)&pMVar4->field_0x10,0,*(long *)&pMVar4->field_0x20 - *(long *)&pMVar4->field_0x18
        );
  *RemSP::P_ = 0;
  RemSP::length_ = 1;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar15 = (long)*(int *)&pMVar5->field_0x8;
  if (0 < lVar15) {
    iVar2 = *(int *)&pMVar5->field_0xc;
    do {
      if (0 < iVar2) {
        pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
        lVar24 = **(long **)&pMVar5->field_0x48 * local_60 + *(long *)&pMVar5->field_0x10;
        pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
        lVar22 = **(long **)&pMVar4->field_0x48;
        lVar21 = lVar22 * local_60 + *(long *)&pMVar4->field_0x10;
        lVar22 = lVar21 - lVar22;
        iVar25 = (int)local_60 * iVar2;
        iVar30 = 0;
        do {
          lVar23 = (long)iVar30;
          iVar16 = iVar30;
          if (*(char *)(lVar24 + lVar23) != '\0') {
            iVar12 = iVar30 + iVar25;
            psVar1 = &(this->s_queue_).size_;
            *psVar1 = *psVar1 + 1;
            piVar6 = (this->s_queue_).buffer_;
            sVar28 = (this->s_queue_).tail_;
            piVar6[sVar28] = iVar12;
            uVar11 = (this->s_queue_).capacity_;
            iVar16 = iVar30 + 1;
            if (iVar30 + 1 < iVar2) {
              iVar16 = iVar2;
            }
            (this->s_queue_).tail_ = (sVar28 + 1) % uVar11;
            iVar26 = iVar30;
            do {
              lVar23 = lVar23 + 1;
              iVar13 = iVar16;
              if (iVar2 <= lVar23) break;
              iVar13 = iVar26 + 1;
              iVar26 = iVar13;
            } while (*(char *)(lVar24 + lVar23) != '\0');
            iVar16 = iVar13 + -1;
            iVar29 = iVar16 + iVar25;
            psVar1 = &(this->e_queue_).size_;
            *psVar1 = *psVar1 + 1;
            piVar7 = (this->e_queue_).buffer_;
            sVar28 = (this->e_queue_).tail_;
            piVar7[sVar28] = iVar29;
            sVar27 = (this->s_queue_).head_;
            uVar19 = (this->e_queue_).capacity_;
            (this->e_queue_).tail_ = (sVar28 + 1) % uVar19;
            uVar18 = (this->e_queue_).head_;
            iVar14 = (iVar12 - iVar2) - (uint)(iVar30 != 0);
            iVar26 = piVar7[uVar18];
            if (iVar26 < iVar14) {
              sVar28 = (this->e_queue_).size_;
              sVar27 = (this->s_queue_).size_;
              uVar17 = (this->s_queue_).head_;
              do {
                sVar27 = sVar27 - 1;
                uVar17 = (uVar17 + 1) % uVar11;
                sVar28 = sVar28 - 1;
                uVar18 = (uVar18 + 1) % uVar19;
                iVar26 = piVar7[uVar18];
              } while (iVar26 < iVar14);
              iVar14 = piVar6[uVar17];
              (this->s_queue_).size_ = sVar27;
              (this->s_queue_).head_ = uVar17;
              (this->e_queue_).size_ = sVar28;
              (this->e_queue_).head_ = uVar18;
            }
            else {
              iVar14 = piVar6[sVar27];
            }
            iVar29 = iVar29 - iVar2;
            iVar13 = (uint)(iVar13 != iVar2) + iVar29;
            if (iVar13 < iVar14) {
              RemSP::P_[RemSP::length_] = RemSP::length_;
              uVar9 = RemSP::length_;
              RemSP::length_ = RemSP::length_ + 1;
              uVar3 = (uint)((long)iVar12 % (long)iVar2);
              uVar20 = (iVar16 - iVar30) + uVar3 + 1;
              if (uVar3 < uVar20) {
                uVar11 = (long)iVar12 % (long)iVar2 & 0xffffffff;
                do {
                  *(uint *)(lVar21 + uVar11 * 4) = uVar9;
                  uVar11 = uVar11 + 1;
                } while (uVar20 != uVar11);
              }
            }
            else {
              uVar3 = *(uint *)(lVar22 + (long)(iVar14 % iVar2) * 4);
              uVar9 = (uint)((long)iVar12 % (long)iVar2);
              uVar20 = (iVar16 - iVar30) + uVar9 + 1;
              if (uVar9 < uVar20) {
                uVar11 = (long)iVar12 % (long)iVar2 & 0xffffffff;
                do {
                  *(uint *)(lVar21 + uVar11 * 4) = uVar3;
                  uVar11 = uVar11 + 1;
                } while (uVar20 != uVar11);
              }
              bVar8 = iVar26 <= iVar29;
              if (iVar26 <= iVar29) {
                bVar10 = false;
                do {
                  if (bVar10) {
                    RemSP::Merge(*(uint *)(lVar22 + (long)(iVar14 % iVar2) * 4),uVar3);
                  }
                  psVar1 = &(this->s_queue_).size_;
                  *psVar1 = *psVar1 - 1;
                  uVar11 = ((this->s_queue_).head_ + 1) % (this->s_queue_).capacity_;
                  (this->s_queue_).head_ = uVar11;
                  iVar14 = (this->s_queue_).buffer_[uVar11];
                  psVar1 = &(this->e_queue_).size_;
                  *psVar1 = *psVar1 - 1;
                  uVar11 = ((this->e_queue_).head_ + 1) % (this->e_queue_).capacity_;
                  (this->e_queue_).head_ = uVar11;
                  iVar26 = (this->e_queue_).buffer_[uVar11];
                  bVar10 = true;
                } while (iVar26 <= iVar29);
              }
              if (iVar26 <= iVar29) {
                uVar11 = (this->e_queue_).head_;
                sVar28 = (this->e_queue_).size_;
                uVar19 = (this->s_queue_).head_;
                sVar27 = (this->s_queue_).size_;
                piVar6 = (this->s_queue_).buffer_;
                do {
                  sVar27 = sVar27 - 1;
                  uVar19 = (uVar19 + 1) % (this->s_queue_).capacity_;
                  sVar28 = sVar28 - 1;
                  uVar11 = (uVar11 + 1) % (this->e_queue_).capacity_;
                } while ((this->e_queue_).buffer_[uVar11] <= iVar29);
                (this->s_queue_).size_ = sVar27;
                (this->s_queue_).head_ = uVar19;
                (this->e_queue_).size_ = sVar28;
                (this->e_queue_).head_ = uVar11;
                iVar14 = piVar6[uVar19];
                bVar8 = true;
              }
              if ((iVar14 <= iVar13) && (bVar8)) {
                RemSP::Merge(*(uint *)(lVar21 + (long)(int)uVar9 * 4),
                             *(uint *)(lVar22 + (long)(iVar14 % iVar2) * 4));
              }
            }
          }
          iVar30 = iVar16 + 1;
        } while (iVar30 < iVar2);
      }
      local_60 = local_60 + 1;
    } while (local_60 != lVar15);
  }
  return;
}

Assistant:

void FirstScan()
    {
        memset(img_labels_.data, 0, img_labels_.dataend - img_labels_.datastart); // Initialization
        LabelsSolver::Setup();

        // Scan Mask (Rosenfeld)
        // +-+-+-+
        // |p|q|r|
        // +-+-+-+
        // |s|x|
        // +-+-+

        // First Scan
        int w(img_.cols); // w = N in the paper naming convention
        int h(img_.rows);

        for (int r = 0; r < h; r += 1) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            // const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            unsigned int* const img_labels_row = img_labels_.ptr<unsigned int>(r);
            unsigned int* const img_labels_row_prev = (unsigned int*)(((char*)img_labels_row) - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 1) {

                // Is there a new run ?
                if (img_row[c] == 0) {
                    continue;
                }

                // clb (consider left border) and crb (consider right border) are used to handle border cases ignored by
                // the original paper.

                // Yes (new run)
                // 1) We need to record the new run r(s,e)
                int clb = c != 0; // Consider left border
                int s = s_queue_.Enqueue(w * r + c++); // Current run starting index
                for (; c < w && img_row[c] > 0; c += 1) {}
                int crb = c != w; // Consider right border (derived by c - 1 != w - 1)
                int e = e_queue_.Enqueue(w * r + --c); // Current run end index

                // 2) Discard all the runs until a run r(h,t) that end after/at s - N - 1 (t in the following scheme)
                // +-+-+-+-+-+-+-+-+-+
                // | |t|>| | | | | | |
                // +-+-+-+-+-+-+-+-+-+
                // | | |s| | | |e| | |
                // +-+-+-+-+-+-+-+-+-+
                // This run always exists. It is at most the run we just found.
                int h = s_queue_.Front();
                int t = e_queue_.Front();
                while (t < s - w - clb) {
                    h = s_queue_.DequeueAndFront();
                    t = e_queue_.DequeueAndFront();
                }

                // 3A) If the run r(h,t) starts before/at e - N + 1 (h in the following scheme)
                // +-+-+-+-+-+-+-+-+-+
                // | | | | | | |<|h| |
                // +-+-+-+-+-+-+-+-+-+
                // | | |s| | | |e| | |
                // +-+-+-+-+-+-+-+-+-+
                // it connects to the current run so we update the label of the current run
                // with that of the run(h,t), taking the value from p(h) -> p(r - 1, h % w)
                // The condition (e - w + 1) % w != 0 that can be simplified as (e + 1) % w != 0 
                // is for the handling of (left) border cases that were ignored by the original 
                // paper in which the border is always considered black (background).
                bool next = false;
                if (h <= e - w + crb) {
                    unsigned val = img_labels_row_prev[h % w];
                    unsigned start = s % w;
                    for (unsigned i = start; i < start + e - s + 1; ++i) {
                        img_labels_row[i] = val;
                    }

                    // 3B) Moreover, we check for all the following run that end before/at e - N (t
                    // in the following schema), we perform a label merge of that run with the
                    // current one and we remove them from the queues (no other following run can
                    // be directly connected with these).
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | |<|t| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // The label of the current run is val. The label of the run we are analyzing 
                    // from the queue is found at p(h) -> p(r - 1, h % w).
                    while (t <= e - w) {
                        if (next) {
                            LabelsSolver::Merge(img_labels_row_prev[h % w], val);
                        }
                        next = true;
                        h = s_queue_.DequeueAndFront();
                        t = e_queue_.DequeueAndFront();
                    }

                    // 4) We check for the next run which ends after/at e - N + 1 (t in the following
                    // schema. It always exists and it is at most the current run.
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | | | |t|>|
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    while (t < e - w + 1) {
                        next = true;
                        s_queue_.Dequeue();
                        e_queue_.Dequeue();
                        h = s_queue_.Front();
                        t = e_queue_.Front();
                    }

                    // We must keep the run in the list but we may need to merge labels:
                    // If the run p(h, t) starts before/at e - N + 1 (h in the following
                    // schema) it connects to the current run so we need to merge labels.
                    // +-+-+-+-+-+-+-+-+-+
                    // | | | | | | |<|h| |
                    // +-+-+-+-+-+-+-+-+-+
                    // | | |s| | | |e| | |
                    // +-+-+-+-+-+-+-+-+-+
                    // The condition (e - w + 1) % w != 0 that can be simplified as (e + 1) % w != 0 
                    // is for the handling of (left) border cases that were ignored by the original 
                    // paper in which the border is always considered black (background).
                    if (h <= e - w + crb) {
                        if (next) {
                            LabelsSolver::Merge(img_labels_row[s % w], img_labels_row_prev[h % w]);
                        }
                    }
                }
                else {
                    // Otherwise it is a run not connected to any other, so we need a new label
                    unsigned val = LabelsSolver::NewLabel();
                    unsigned start = s % w;
                    for (unsigned i = start; i < start + e - s + 1; ++i) {
                        img_labels_row[i] = val;
                    }
                }

            }//End columns's for
        }//End rows's for
        
    }